

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTxyz.hpp
# Opt level: O0

void __thiscall OpenMD::NPTxyz::~NPTxyz(NPTxyz *this)

{
  void *in_RDI;
  
  ~NPTxyz((NPTxyz *)0x2983e8);
  operator_delete(in_RDI,0x328);
  return;
}

Assistant:

NPTxyz(SimInfo* info) : NPTf(info) {}